

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenCallRef(BinaryenModuleRef module,BinaryenExpressionRef target,
               BinaryenExpressionRef *operands,BinaryenIndex numOperands,BinaryenType type,
               bool isReturn)

{
  CallRef *pCVar1;
  undefined3 in_register_00000089;
  ulong uVar2;
  undefined1 auStack_78 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Builder local_40;
  undefined4 local_34;
  
  local_34 = CONCAT31(in_register_00000089,isReturn);
  args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_78 = (undefined1  [8])0x0;
  args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  for (uVar2 = 0; numOperands != uVar2; uVar2 = uVar2 + 1) {
    local_40.wasm = (Module *)operands[uVar2];
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_78,
               (Expression **)&local_40);
  }
  local_40.wasm = module;
  pCVar1 = wasm::Builder::
           makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                     (&local_40,target,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_78,
                      (Type)type,local_34._0_1_);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_78);
  return (BinaryenExpressionRef)pCVar1;
}

Assistant:

BinaryenExpressionRef BinaryenCallRef(BinaryenModuleRef module,
                                      BinaryenExpressionRef target,
                                      BinaryenExpressionRef* operands,
                                      BinaryenIndex numOperands,
                                      BinaryenType type,
                                      bool isReturn) {
  std::vector<Expression*> args;
  for (BinaryenIndex i = 0; i < numOperands; i++) {
    args.push_back((Expression*)operands[i]);
  }
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeCallRef((Expression*)target, args, Type(type), isReturn));
}